

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaValDecimalCompareWithInteger(xmlSchemaValDecimal *lhs,long rhs)

{
  int iVar1;
  xmlSchemaValDecimal tmpVal;
  char buf [43];
  xmlSchemaValDecimal local_58;
  xmlChar local_48 [56];
  
  iVar1 = snprintf((char *)local_48,0x2b,"%+ld.0",rhs);
  local_58.integralPlaces = iVar1 - 3;
  local_58.fractionalPlaces = 1;
  local_58.str = local_48;
  iVar1 = xmlSchemaValDecimalCompare(lhs,&local_58);
  return iVar1;
}

Assistant:

static int xmlSchemaValDecimalCompareWithInteger(const xmlSchemaValDecimal *lhs, long rhs)
{
    /* can handle integers up to 128 bits, should be good for a while */
    char buf[43];
    xmlSchemaValDecimal tmpVal;
    /* 3 = sign+dot+0+NULL */
    tmpVal.integralPlaces = snprintf(buf, sizeof(buf), "%+ld.0", rhs)-3;
    tmpVal.str = (xmlChar*)buf;
    tmpVal.fractionalPlaces = 1;
    return xmlSchemaValDecimalCompare(lhs, &tmpVal);
}